

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3PoslistCopy(char **pp,char **ppPoslist)

{
  char *__dest;
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  
  bVar2 = 0;
  lVar3 = 0x100000000;
  pbVar1 = (byte *)*ppPoslist;
  while( true ) {
    if (bVar2 == 0 && *pbVar1 == 0) break;
    bVar2 = *pbVar1 & 0x80;
    lVar3 = lVar3 + 0x100000000;
    pbVar1 = pbVar1 + 1;
  }
  if (pp != (char **)0x0) {
    __dest = *pp;
    memcpy(__dest,*ppPoslist,lVar3 >> 0x20);
    *pp = __dest + (lVar3 >> 0x20);
  }
  *ppPoslist = (char *)(pbVar1 + 1);
  return;
}

Assistant:

static void fts3PoslistCopy(char **pp, char **ppPoslist){
  char *pEnd = *ppPoslist;
  char c = 0;

  /* The end of a position list is marked by a zero encoded as an FTS3
  ** varint. A single POS_END (0) byte. Except, if the 0 byte is preceded by
  ** a byte with the 0x80 bit set, then it is not a varint 0, but the tail
  ** of some other, multi-byte, value.
  **
  ** The following while-loop moves pEnd to point to the first byte that is not
  ** immediately preceded by a byte with the 0x80 bit set. Then increments
  ** pEnd once more so that it points to the byte immediately following the
  ** last byte in the position-list.
  */
  while( *pEnd | c ){
    c = *pEnd++ & 0x80;
    testcase( c!=0 && (*pEnd)==0 );
  }
  pEnd++;  /* Advance past the POS_END terminator byte */

  if( pp ){
    int n = (int)(pEnd - *ppPoslist);
    char *p = *pp;
    memcpy(p, *ppPoslist, n);
    p += n;
    *pp = p;
  }
  *ppPoslist = pEnd;
}